

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O3

int Sbd_ManWindow(Sbd_Man_t *p,int Pivot)

{
  Gia_Obj_t *pGVar1;
  Gia_Man_t *pGVar2;
  word *pwVar3;
  word *pwVar4;
  Vec_Wrd_t *pVVar5;
  int *piVar6;
  word *pwVar7;
  int iVar8;
  uint uVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  char *__function;
  long lVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  char *__file;
  ulong uVar16;
  char *__assertion;
  uint uVar17;
  ulong uVar18;
  timespec ts;
  timespec local_50;
  long local_40;
  int local_34;
  
  iVar8 = clock_gettime(3,&local_50);
  if (iVar8 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  p->Pivot = Pivot;
  if ((Pivot < 0) || (p->vTfos->nSize <= Pivot)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  p->vTfo = p->vTfos->pArray + (uint)Pivot;
  pVVar10 = p->vWinObjs;
  pVVar10->nSize = 0;
  if (p->vObj2Var->nSize < 1) {
LAB_0053b498:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *p->vObj2Var->pArray = 0;
  Vec_IntPush(pVVar10,0);
  Gia_ManIncrementTravId(p->pGia);
  pGVar2 = p->pGia;
  if (pGVar2->nTravIdsAlloc < 1) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x265,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
  }
  *pGVar2->pTravIds = pGVar2->nTravIds;
  Sbd_ManWindowSim_rec(p,Pivot);
  iVar8 = p->pPars->nWinSizeMax;
  if ((iVar8 != 0) && (iVar8 < p->vWinObjs->nSize)) {
    iVar8 = clock_gettime(3,&local_50);
    if (iVar8 < 0) {
      lVar13 = -1;
      local_40 = lVar12;
    }
    else {
      lVar13 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      local_40 = lVar12;
    }
LAB_0053b420:
    p->timeWin = p->timeWin + lVar13 + local_40;
    return 0;
  }
  Sbd_ManUpdateOrder(p,Pivot);
  iVar8 = p->vDivVars->nSize;
  if (iVar8 == p->vDivValues->nSize) {
    if (p->vWinObjs->nSize <= iVar8) {
      __assert_fail("Vec_IntSize(p->vDivVars) < Vec_IntSize(p->vWinObjs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                    ,0x1d2,"int Sbd_ManWindow(Sbd_Man_t *, int)");
    }
    if (Pivot < p->pGia->nObjs) {
      pGVar1 = p->pGia->pObjs + (uint)Pivot;
      *(ulong *)pGVar1 = *(ulong *)pGVar1 | 0x40000000;
      uVar14 = p->pPars->nWords;
      uVar11 = uVar14 * Pivot;
      if ((((int)uVar11 < 0) || (p->vSims[1]->nSize <= (int)uVar11)) ||
         (p->vSims[0]->nSize <= (int)uVar11)) goto LAB_0053b479;
      if (0 < (int)uVar14) {
        pwVar3 = p->vSims[1]->pArray;
        pwVar4 = p->vSims[0]->pArray;
        uVar15 = 0;
        do {
          pwVar3[uVar11 + uVar15] = ~pwVar4[uVar11 + uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
      }
      p->vRoots->nSize = 0;
      pVVar10 = p->vTfo;
      if (0 < pVVar10->nSize) {
        lVar13 = 0;
        do {
          uVar14 = pVVar10->pArray[lVar13];
          if ((int)uVar14 < 0) goto LAB_0053b45a;
          uVar11 = uVar14 >> 1;
          if (p->pGia->nObjs <= (int)uVar11) goto LAB_0053b43b;
          pGVar1 = p->pGia->pObjs + uVar11;
          *(ulong *)pGVar1 = *(ulong *)pGVar1 | 0x40000000;
          if ((uVar14 & 1) != 0) {
            Sbd_ManWindowSim_rec(p,uVar11);
            Vec_IntPush(p->vRoots,uVar11);
          }
          lVar13 = lVar13 + 1;
          pVVar10 = p->vTfo;
        } while (lVar13 < pVVar10->nSize);
      }
      local_40 = lVar12;
      if (Pivot < p->pGia->nObjs) {
        pGVar1 = p->pGia->pObjs + (uint)Pivot;
        *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0xffffffffbfffffff;
        pVVar10 = p->vTfo;
        uVar14 = pVVar10->nSize;
        if (0 < (int)uVar14) {
          lVar13 = 0;
          do {
            if (pVVar10->pArray[lVar13] < 0) {
LAB_0053b45a:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar14 = (uint)pVVar10->pArray[lVar13] >> 1;
            if (p->pGia->nObjs <= (int)uVar14) goto LAB_0053b43b;
            pGVar1 = p->pGia->pObjs + uVar14;
            *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0xffffffffbfffffff;
            if (p->vObj2Var->nSize <= (int)uVar14) goto LAB_0053b498;
            pVVar10 = p->vWinObjs;
            p->vObj2Var->pArray[uVar14] = pVVar10->nSize;
            Vec_IntPush(pVVar10,uVar14);
            lVar13 = lVar13 + 1;
            pVVar10 = p->vTfo;
            uVar14 = pVVar10->nSize;
          } while (lVar13 < (int)uVar14);
        }
        iVar8 = p->pPars->nWinSizeMax;
        if ((iVar8 != 0) && (iVar8 < p->vWinObjs->nSize)) {
          iVar8 = clock_gettime(3,&local_50);
          if (iVar8 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
          }
          goto LAB_0053b420;
        }
        uVar11 = p->pPars->nWords;
        uVar15 = (ulong)uVar11;
        uVar9 = uVar11 * Pivot;
        pVVar5 = p->vSims[2];
        if (uVar14 == 0) {
          if (((int)uVar9 < 0) || (pVVar5->nSize <= (int)uVar9)) goto LAB_0053b479;
          if (0 < (int)uVar11) {
            memset(pVVar5->pArray + uVar9,0xff,uVar15 << 3);
          }
        }
        else {
          if (((int)uVar9 < 0) || (iVar8 = pVVar5->nSize, iVar8 <= (int)uVar9)) {
LAB_0053b479:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                          ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          if (0 < (int)uVar11) {
            local_34 = iVar8;
            memset(pVVar5->pArray + uVar9,0,uVar15 * 8);
            iVar8 = local_34;
          }
          if (0 < (int)uVar14) {
            piVar6 = pVVar10->pArray;
            uVar9 = uVar11 * Pivot;
            uVar16 = 0;
            do {
              uVar17 = piVar6[uVar16];
              if ((int)uVar17 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x130,"int Abc_LitIsCompl(int)");
              }
              if ((uVar17 & 1) != 0) {
                if ((((iVar8 <= (int)uVar9 || (int)uVar9 < 0) ||
                     (uVar17 = (uVar17 >> 1) * uVar11, (int)uVar17 < 0)) ||
                    (p->vSims[0]->nSize <= (int)uVar17)) || (p->vSims[1]->nSize <= (int)uVar17))
                goto LAB_0053b479;
                if (0 < (int)uVar11) {
                  pwVar3 = pVVar5->pArray;
                  pwVar4 = p->vSims[0]->pArray;
                  pwVar7 = p->vSims[1]->pArray;
                  uVar18 = 0;
                  do {
                    pwVar3[uVar9 + uVar18] =
                         pwVar3[uVar9 + uVar18] | pwVar7[uVar17 + uVar18] ^ pwVar4[uVar17 + uVar18];
                    uVar18 = uVar18 + 1;
                  } while (uVar15 != uVar18);
                }
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != uVar14);
          }
        }
        iVar8 = clock_gettime(3,&local_50);
        if (iVar8 < 0) {
          lVar12 = -1;
        }
        else {
          lVar12 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
        }
        p->timeWin = p->timeWin + lVar12 + local_40;
        Sbd_ManPropagateControl(p,Pivot);
        if (p->vDivValues->nSize < 0x41) {
          return 1;
        }
        __assert_fail("Vec_IntSize(p->vDivValues) <= 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                      ,0x1f8,"int Sbd_ManWindow(Sbd_Man_t *, int)");
      }
    }
LAB_0053b43b:
    __assertion = "v >= 0 && v < p->nObjs";
    __file = "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h";
    __function = "Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)";
  }
  else {
    __assertion = "Vec_IntSize(p->vDivVars) == Vec_IntSize(p->vDivValues)";
    __file = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c";
    __function = "int Sbd_ManWindow(Sbd_Man_t *, int)";
  }
  __assert_fail(__assertion,__file,0x1d1,__function);
}

Assistant:

int Sbd_ManWindow( Sbd_Man_t * p, int Pivot )
{
    abctime clk = Abc_Clock();
    int i, Node;
    // assign pivot and TFO (assume siminfo is assigned at the PIs)
    p->Pivot = Pivot;
    p->vTfo = Vec_WecEntry( p->vTfos, Pivot );
    // add constant node
    Vec_IntClear( p->vWinObjs );
    Vec_IntWriteEntry( p->vObj2Var, 0, Vec_IntSize(p->vWinObjs) );
    Vec_IntPush( p->vWinObjs, 0 );
    // simulate TFI cone
    Gia_ManIncrementTravId( p->pGia );
    Gia_ObjSetTravIdCurrentId(p->pGia, 0);
    Sbd_ManWindowSim_rec( p, Pivot );
    if ( p->pPars->nWinSizeMax && Vec_IntSize(p->vWinObjs) > p->pPars->nWinSizeMax )
    {
        p->timeWin += Abc_Clock() - clk;
        return 0;
    }
    Sbd_ManUpdateOrder( p, Pivot );
    assert( Vec_IntSize(p->vDivVars) == Vec_IntSize(p->vDivValues) );
    assert( Vec_IntSize(p->vDivVars) < Vec_IntSize(p->vWinObjs) );
    // simulate node
    Gia_ManObj(p->pGia, Pivot)->fMark0 = 1;
    Abc_TtCopy( Sbd_ObjSim1(p, Pivot), Sbd_ObjSim0(p, Pivot), p->pPars->nWords, 1 );
    // mark TFO and simulate extended TFI without adding TFO nodes
    Vec_IntClear( p->vRoots );
    Vec_IntForEachEntry( p->vTfo, Node, i )
    {
        Gia_ManObj(p->pGia, Abc_Lit2Var(Node))->fMark0 = 1;
        if ( !Abc_LitIsCompl(Node) ) 
            continue;
        Sbd_ManWindowSim_rec( p, Abc_Lit2Var(Node) );
        Vec_IntPush( p->vRoots, Abc_Lit2Var(Node) );
    }
    // add TFO nodes and remove marks
    Gia_ManObj(p->pGia, Pivot)->fMark0 = 0;
    Vec_IntForEachEntry( p->vTfo, Node, i )
    {
        Gia_ManObj(p->pGia, Abc_Lit2Var(Node))->fMark0 = 0;
        Vec_IntWriteEntry( p->vObj2Var, Abc_Lit2Var(Node), Vec_IntSize(p->vWinObjs) );
        Vec_IntPush( p->vWinObjs, Abc_Lit2Var(Node) );
    }
    if ( p->pPars->nWinSizeMax && Vec_IntSize(p->vWinObjs) > p->pPars->nWinSizeMax )
    {
        p->timeWin += Abc_Clock() - clk;
        return 0;
    }
    // compute controlability for node
    if ( Vec_IntSize(p->vTfo) == 0 )
        Abc_TtFill( Sbd_ObjSim2(p, Pivot), p->pPars->nWords );
    else
        Abc_TtClear( Sbd_ObjSim2(p, Pivot), p->pPars->nWords );
    Vec_IntForEachEntry( p->vTfo, Node, i )
        if ( Abc_LitIsCompl(Node) ) // root
            Abc_TtOrXor( Sbd_ObjSim2(p, Pivot), Sbd_ObjSim0(p, Abc_Lit2Var(Node)), Sbd_ObjSim1(p, Abc_Lit2Var(Node)), p->pPars->nWords );
    p->timeWin += Abc_Clock() - clk;
    // propagate controlability to fanins for the TFI nodes starting from the pivot
    Sbd_ManPropagateControl( p, Pivot );
    assert( Vec_IntSize(p->vDivValues) <= 64 );
    return (int)(Vec_IntSize(p->vDivValues) <= 64);
}